

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O3

void __thiscall
AllocationPolicyManager::ReportFailure(AllocationPolicyManager *this,size_t byteCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 *in_FS_OFFSET;
  
  if (this[0x10] == (AllocationPolicyManager)0x1) {
    CCLock::Enter((CCLock *)(this + 0x18));
    uVar4 = *(ulong *)(this + 8);
    if (uVar4 < byteCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/AllocationPolicyManager.h"
                         ,0x9f,"(currentMemory >= byteCount)","currentMemory >= byteCount");
      if (!bVar3) {
LAB_00256c06:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      uVar4 = *(ulong *)(this + 8);
    }
    if (uVar4 < byteCount) {
      byteCount = uVar4;
    }
    *(ulong *)(this + 8) = uVar4 - byteCount;
    if (*(code **)(this + 0x60) != (code *)0x0) {
      (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),2,byteCount);
    }
    CCLock::Leave((CCLock *)(this + 0x18));
  }
  else {
    uVar4 = *(ulong *)(this + 8);
    if (uVar4 < byteCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/AllocationPolicyManager.h"
                         ,0x9f,"(currentMemory >= byteCount)","currentMemory >= byteCount");
      if (!bVar3) goto LAB_00256c06;
      *puVar1 = 0;
      uVar4 = *(ulong *)(this + 8);
    }
    if (uVar4 < byteCount) {
      byteCount = uVar4;
    }
    *(ulong *)(this + 8) = uVar4 - byteCount;
    if (*(code **)(this + 0x60) != (code *)0x0) {
      (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),2,byteCount);
      return;
    }
  }
  return;
}

Assistant:

void ReportFailure(size_t byteCount)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }
        else
        {
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }

    }